

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp,OPJ_UINT32 pino,OPJ_UINT32 tileno)

{
  char cVar1;
  opj_tcp_t *poVar2;
  char *pcVar3;
  OPJ_UINT32 OVar4;
  long lVar5;
  OPJ_UINT32 *pOVar6;
  
  if (cp->th * cp->tw <= tileno) {
    __assert_fail("tileno < (cp->tw * cp->th)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x6c4,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
  }
  poVar2 = cp->tcps;
  if (pino < poVar2[tileno].numpocs + 1) {
    pcVar3 = opj_j2k_convert_progression_order(poVar2[tileno].prg);
    if (*pcVar3 == '\0') {
      __assert_fail("strlen(prog) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x6d0,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
    }
    if ((*(byte *)((long)&cp->m_specific_param + 0x11) & 8) == 0) {
      OVar4 = 1;
    }
    else {
      OVar4 = 1;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        cVar1 = pcVar3[lVar5];
        pOVar6 = &poVar2[tileno].pocs[pino].compE;
        if ((((cVar1 == 'C') || (pOVar6 = &poVar2[tileno].pocs[pino].layE, cVar1 == 'L')) ||
            (pOVar6 = &poVar2[tileno].pocs[pino].prcE, cVar1 == 'P')) ||
           (pOVar6 = &poVar2[tileno].pocs[pino].resE, cVar1 == 'R')) {
          OVar4 = OVar4 * *pOVar6;
        }
        if ((uint)(cp->m_specific_param).m_enc.m_tp_flag == (int)cVar1) {
          (cp->m_specific_param).m_dec.m_layer = (OPJ_UINT32)lVar5;
          return OVar4;
        }
      }
    }
    return OVar4;
  }
  __assert_fail("pino < (cp->tcps[tileno].numpocs + 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x6c5,"OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

static OPJ_UINT32 opj_j2k_get_num_tp(opj_cp_t *cp, OPJ_UINT32 pino,
                                     OPJ_UINT32 tileno)
{
    const OPJ_CHAR *prog = 00;
    OPJ_INT32 i;
    OPJ_UINT32 tpnum = 1;
    opj_tcp_t *tcp = 00;
    opj_poc_t * l_current_poc = 00;

    /*  preconditions */
    assert(tileno < (cp->tw * cp->th));
    assert(pino < (cp->tcps[tileno].numpocs + 1));

    /* get the given tile coding parameter */
    tcp = &cp->tcps[tileno];
    assert(tcp != 00);

    l_current_poc = &(tcp->pocs[pino]);
    assert(l_current_poc != 0);

    /* get the progression order as a character string */
    prog = opj_j2k_convert_progression_order(tcp->prg);
    assert(strlen(prog) > 0);

    if (cp->m_specific_param.m_enc.m_tp_on == 1) {
        for (i = 0; i < 4; ++i) {
            switch (prog[i]) {
            /* component wise */
            case 'C':
                tpnum *= l_current_poc->compE;
                break;
            /* resolution wise */
            case 'R':
                tpnum *= l_current_poc->resE;
                break;
            /* precinct wise */
            case 'P':
                tpnum *= l_current_poc->prcE;
                break;
            /* layer wise */
            case 'L':
                tpnum *= l_current_poc->layE;
                break;
            }
            /* whould we split here ? */
            if (cp->m_specific_param.m_enc.m_tp_flag == prog[i]) {
                cp->m_specific_param.m_enc.m_tp_pos = i;
                break;
            }
        }
    } else {
        tpnum = 1;
    }

    return tpnum;
}